

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O2

bool Function_Template::form2_LookupTable(LookupTableForm2 LookupTable)

{
  uint8_t uVar1;
  bool bVar2;
  allocator_type local_a9;
  vector<unsigned_char,_std::allocator<unsigned_char>_> lookupTable;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  vector<unsigned_char,_std::allocator<unsigned_char>_> normalized;
  Image output;
  Image input;
  
  Unit_Test::intensityArray(&intensity,2);
  Unit_Test::randomImage(&input,&intensity);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (&output,input._width,input._height,'\x01','\x01');
  uVar1 = Unit_Test::intensityValue();
  PenguinV_Image::ImageTemplate<unsigned_char>::fill(&output,uVar1);
  normalized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&lookupTable,0x100,(value_type_conflict1 *)&normalized,&local_a9);
  uVar1 = Unit_Test::intensityValue();
  lookupTable.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start
  [*intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start] = uVar1;
  uVar1 = Unit_Test::intensityValue();
  lookupTable.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start
  [intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
   super__Vector_impl_data._M_start[1]] = uVar1;
  (*LookupTable)(&input,&output,&lookupTable);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&normalized,2,&local_a9);
  *(uchar *)CONCAT71(normalized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start._1_7_,
                     normalized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start._0_1_) =
       lookupTable.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start
       [*intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start];
  *(uchar *)(CONCAT71(normalized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start._1_7_,
                      normalized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start._0_1_) + 1) =
       lookupTable.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start
       [intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start[1]];
  bVar2 = Unit_Test::verifyImage(&output,&normalized,true);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&normalized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&lookupTable.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&output);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&input);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return bVar2;
}

Assistant:

bool form2_LookupTable(LookupTableForm2 LookupTable)
    {
        const std::vector < uint8_t > intensity = intensityArray( 2 );
        PenguinV_Image::Image input  = randomImage( intensity );
        PenguinV_Image::Image output( input.width(), input.height() );

        output.fill( intensityValue() );

        std::vector < uint8_t > lookupTable( 256, 0 );

        lookupTable[intensity[0]] = intensityValue();
        lookupTable[intensity[1]] = intensityValue();

        LookupTable( input, output, lookupTable );

        std::vector < uint8_t > normalized( 2 );

        normalized[0] = lookupTable[intensity[0]];
        normalized[1] = lookupTable[intensity[1]];

        return verifyImage( output, normalized );
    }